

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFastHuf.cpp
# Opt level: O2

void __thiscall
Imf_2_5::FastHufDecoder::decode
          (FastHufDecoder *this,uchar *src,int numSrcBits,unsigned_short *dst,int numDstElems)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  InputExc *this_00;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  int *piVar7;
  uint uVar8;
  int local_5c;
  Int64 buffer;
  Int64 bufferBack;
  uchar *currByte;
  int *local_40;
  int bufferBackNumBits;
  
  if (numSrcBits < 0x80) {
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    pcVar5 = "Error choosing Huffman decoder implementation (insufficient number of bits).";
LAB_00410c49:
    Iex_2_5::InputExc::InputExc(this_00,pcVar5);
    __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  currByte = src + 0x10;
  local_5c = numSrcBits + -0x80;
  uVar6 = *(ulong *)src;
  buffer = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
           (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
           (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
  uVar6 = *(ulong *)(src + 8);
  bufferBack = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18
               | (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 |
               (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
  bufferBackNumBits = 0x40;
  local_40 = this->_tableSymbol;
  uVar8 = 0;
  do {
    uVar4 = 0x40;
    do {
      if (numDstElems <= (int)uVar8) {
        if (local_5c == 0) {
          return;
        }
        this_00 = (InputExc *)__cxa_allocate_exception(0x48);
        pcVar5 = 
        "Huffman decode error (Compressed data remains after filling expected output buffer).";
        goto LAB_00410c49;
      }
      if (buffer < this->_tableMin) {
        if (uVar4 < 0x40) {
          refill(this,&buffer,0x40 - uVar4,&bufferBack,&bufferBackNumBits,&currByte,&local_5c);
          uVar4 = 0x40;
        }
        lVar1 = -0x34;
        do {
          lVar3 = lVar1;
          if (this->_ljOffset[lVar3 + 6] <= buffer) break;
          lVar1 = lVar3 + 1;
        } while (lVar3 + 0x41U <= (ulong)this->_maxCodeLength);
        if (lVar3 + 0x41U <= (ulong)this->_maxCodeLength) {
          uVar6 = (buffer >> (-(char)(lVar3 + 1) & 0x3fU)) +
                  *(long *)(this->_tableSymbol + lVar3 * 2 + 0xc);
          if (uVar6 < (ulong)(long)this->_numSymbols) {
            uVar2 = (int)lVar3 + 0x41;
            piVar7 = this->_idToSymbol + uVar6;
            goto LAB_00410b06;
          }
        }
        this_00 = (InputExc *)__cxa_allocate_exception(0x48);
        pcVar5 = "Huffman decode error (Decoded an invalid symbol).";
        goto LAB_00410c49;
      }
      uVar2 = (uint)this->_tableCodeLen[buffer >> 0x34];
      piVar7 = local_40 + (buffer >> 0x34);
LAB_00410b06:
      buffer = buffer << ((byte)uVar2 & 0x3f);
      uVar4 = uVar4 - uVar2;
      if (*piVar7 == this->_rleSymbol) {
        if ((int)uVar4 < 8) {
          refill(this,&buffer,0x40 - uVar4,&bufferBack,&bufferBackNumBits,&currByte,&local_5c);
          uVar4 = 0x40;
        }
        if ((int)uVar8 < 1) {
          this_00 = (InputExc *)__cxa_allocate_exception(0x48);
          pcVar5 = "Huffman decode error (RLE code with no previous symbol).";
          goto LAB_00410c49;
        }
        uVar2 = (byte)(buffer >> 0x38) + uVar8;
        if (numDstElems < (int)uVar2) {
          this_00 = (InputExc *)__cxa_allocate_exception(0x48);
          pcVar5 = "Huffman decode error (Symbol run beyond expected output buffer length).";
          goto LAB_00410c49;
        }
        if (buffer >> 0x38 == 0) {
          this_00 = (InputExc *)__cxa_allocate_exception(0x48);
          pcVar5 = "Huffman decode error (Invalid RLE length)";
          goto LAB_00410c49;
        }
        for (uVar6 = 0; buffer >> 0x38 != uVar6; uVar6 = uVar6 + 1) {
          dst[uVar8 + uVar6] = dst[(ulong)uVar8 - 1];
        }
        buffer = buffer << 8;
        uVar4 = uVar4 - 8;
        uVar8 = uVar2;
      }
      else {
        dst[(int)uVar8] = (unsigned_short)*piVar7;
        uVar8 = uVar8 + 1;
      }
    } while (0xb < (int)uVar4);
    refill(this,&buffer,0x40 - uVar4,&bufferBack,&bufferBackNumBits,&currByte,&local_5c);
  } while( true );
}

Assistant:

void
FastHufDecoder::decode
    (const unsigned char *src,
     int numSrcBits,
     unsigned short *dst, 
     int numDstElems)
{
    if (numSrcBits < 128)
        throw IEX_NAMESPACE::InputExc ("Error choosing Huffman decoder implementation "
                                       "(insufficient number of bits).");

    //
    // Current position (byte/bit) in the src data stream
    // (after the first buffer fill)
    //

    const unsigned char *currByte = src + 2 * sizeof (Int64);

    numSrcBits -= 8 * 2 * sizeof (Int64);

    //
    // 64-bit buffer holding the current bits in the stream
    //

    Int64 buffer            = READ64 (src); 
    int   bufferNumBits     = 64;

    //
    // 64-bit buffer holding the next bits in the stream
    //

    Int64 bufferBack        = READ64 ((src + sizeof (Int64))); 
    int   bufferBackNumBits = 64;

    int dstIdx = 0;

    while (dstIdx < numDstElems)
    {
        int  codeLen;
        int  symbol;

        //
        // Test if we can be table accelerated. If so, directly
        // lookup the output symbol. Otherwise, we need to fall
        // back to searching for the code.
        //
        // If we're doing table lookups, we don't really need
        // a re-filled buffer, so long as we have TABLE_LOOKUP_BITS
        // left. But for a search, we do need a refilled table.
        //

        if (_tableMin <= buffer)
        {
            int tableIdx = buffer >> (64 - TABLE_LOOKUP_BITS);

            // 
            // For invalid codes, _tableCodeLen[] should return 0. This
            // will cause the decoder to get stuck in the current spot
            // until we run out of elements, then barf that the codestream
            // is bad.  So we don't need to stick a condition like
            //     if (codeLen > _maxCodeLength) in this inner.
            //

            codeLen = _tableCodeLen[tableIdx];
            symbol  = _tableSymbol[tableIdx];
        }
        else
        {
            if (bufferNumBits < 64)
            {
                refill (buffer,
                        64 - bufferNumBits,
                        bufferBack,
                        bufferBackNumBits,
                        currByte,
                        numSrcBits);

                bufferNumBits = 64;
            }

            // 
            // Brute force search: 
            // Find the smallest length where _ljBase[length] <= buffer
            //

            codeLen = TABLE_LOOKUP_BITS + 1;

            while (_ljBase[codeLen] > buffer && codeLen <= _maxCodeLength)
                codeLen++;

            if (codeLen > _maxCodeLength)
            {
                throw IEX_NAMESPACE::InputExc ("Huffman decode error "
                                               "(Decoded an invalid symbol).");
            }

            Int64 id = _ljOffset[codeLen] + (buffer >> (64 - codeLen));
            if (id < static_cast<Int64>(_numSymbols))
            {
                symbol = _idToSymbol[id];
            }
            else
            {
                throw IEX_NAMESPACE::InputExc ("Huffman decode error "
                                               "(Decoded an invalid symbol).");
            }
        }

        //
        // Shift over bit stream, and update the bit count in the buffer
        //

        buffer = buffer << codeLen;
        bufferNumBits -= codeLen;

        //
        // If we recieved a RLE symbol (_rleSymbol), then we need
        // to read ahead 8 bits to know how many times to repeat
        // the previous symbol. Need to ensure we at least have
        // 8 bits of data in the buffer
        //

        if (symbol == _rleSymbol)
        {
            if (bufferNumBits < 8)
            {
                refill (buffer,
                        64 - bufferNumBits,
                        bufferBack,
                        bufferBackNumBits,
                        currByte,
                        numSrcBits);

                bufferNumBits = 64;
            }

            int rleCount = buffer >> 56;

            if (dstIdx < 1)
            {
                throw IEX_NAMESPACE::InputExc ("Huffman decode error (RLE code "
                                               "with no previous symbol).");
            }

            if (dstIdx + rleCount > numDstElems)
            {
                throw IEX_NAMESPACE::InputExc ("Huffman decode error (Symbol run "
                                               "beyond expected output buffer length).");
            }

            if (rleCount <= 0) 
            {
                throw IEX_NAMESPACE::InputExc("Huffman decode error"
                                              " (Invalid RLE length)");
            }

            for (int i = 0; i < rleCount; ++i)
                dst[dstIdx + i] = dst[dstIdx - 1];

            dstIdx += rleCount;

            buffer = buffer << 8;
            bufferNumBits -= 8;
        }
        else
        {
            dst[dstIdx] = symbol;
            dstIdx++;
        }

        //
        // refill bit stream buffer if we're below the number of 
        // bits needed for a table lookup
        //

        if (bufferNumBits < TABLE_LOOKUP_BITS)
        {
            refill (buffer,
                    64 - bufferNumBits,
                    bufferBack,
                    bufferBackNumBits,
                    currByte,
                    numSrcBits);

            bufferNumBits = 64;
        }
    }

    if (numSrcBits != 0)
    {
        throw IEX_NAMESPACE::InputExc ("Huffman decode error (Compressed data remains "
                                       "after filling expected output buffer).");
    }
}